

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::StrictTargetComparison::operator()
          (StrictTargetComparison *this,cmGeneratorTarget *t1,cmGeneratorTarget *t2)

{
  char *pcVar1;
  int iVar2;
  string *psVar3;
  
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(t1);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(t2);
  iVar2 = strcmp(pcVar1,(psVar3->_M_dataplus)._M_p);
  if (iVar2 == 0) {
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(t1->LocalGenerator);
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(t2->LocalGenerator);
    iVar2 = strcmp(pcVar1,(psVar3->_M_dataplus)._M_p);
  }
  return SUB41((uint)iVar2 >> 0x1f,0);
}

Assistant:

bool cmGeneratorTarget::StrictTargetComparison::operator()(
  cmGeneratorTarget const* t1, cmGeneratorTarget const* t2) const
{
  int nameResult = strcmp(t1->GetName().c_str(), t2->GetName().c_str());
  if (nameResult == 0) {
    return strcmp(
             t1->GetLocalGenerator()->GetCurrentBinaryDirectory().c_str(),
             t2->GetLocalGenerator()->GetCurrentBinaryDirectory().c_str()) < 0;
  }
  return nameResult < 0;
}